

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralizedMAAStarPlannerForDecPOMDPDiscrete.cpp
# Opt level: O1

PJPDP_sharedPtr __thiscall
GeneralizedMAAStarPlannerForDecPOMDPDiscrete::ConstructExtendedJointPolicy
          (GeneralizedMAAStarPlannerForDecPOMDPDiscrete *this,
          PartialJointPolicyDiscretePure *jpolPrevTs,JointPolicyDiscretePure *jpolBG,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nrOHts,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *firstOHtsI)

{
  _func_int **pp_Var1;
  int iVar2;
  undefined4 uVar3;
  PartialJointPolicyPureVector *this_00;
  undefined4 extraout_var;
  E *this_01;
  shared_count extraout_RDX;
  uint uVar4;
  ulong uVar5;
  long *in_R9;
  ulong uVar6;
  PJPDP_sharedPtr PVar7;
  
  if ((jpolBG->super_JointPolicyDiscrete)._m_indexDomCat == OHIST_INDEX) {
    if (*(int *)&nrOHts[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start == 0) {
      this_00 = (PartialJointPolicyPureVector *)operator_new(0x88);
      PartialJointPolicyPureVector::PartialJointPolicyPureVector
                (this_00,(PartialJointPolicyDiscretePure *)jpolBG);
      boost::shared_ptr<PartialJointPolicyDiscretePure>::shared_ptr<PartialJointPolicyPureVector>
                ((shared_ptr<PartialJointPolicyDiscretePure> *)this,this_00);
      pp_Var1 = (this->super_PlanningUnitDecPOMDPDiscrete).super_PlanningUnitMADPDiscrete.
                super_PlanningUnit._vptr_PlanningUnit;
      (**(code **)(*pp_Var1 + 0x10))(pp_Var1,pp_Var1[1] + 1);
      uVar4 = 0;
      while( true ) {
        iVar2 = (*(jpolPrevTs->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.
                  super_JointPolicy._vptr_JointPolicy[6])();
        uVar5 = (ulong)uVar4;
        if (CONCAT44(extraout_var,iVar2) <= uVar5) break;
        if (*(long *)((firstOHtsI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start + uVar5 * 2) != 0) {
          uVar6 = 0;
          do {
            iVar2 = *(int *)(*in_R9 + uVar5 * 4);
            pp_Var1 = (this->super_PlanningUnitDecPOMDPDiscrete).super_PlanningUnitMADPDiscrete.
                      super_PlanningUnit._vptr_PlanningUnit;
            uVar3 = (*(code *)(nrOHts->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_start[0x13])(nrOHts,uVar4,uVar6);
            (**(code **)(*pp_Var1 + 0x80))(pp_Var1,uVar4,iVar2 + (int)uVar6,uVar3);
            uVar6 = (ulong)((int)uVar6 + 1);
          } while (uVar6 < *(ulong *)((firstOHtsI->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar5 * 2));
        }
        uVar4 = uVar4 + 1;
      }
      PVar7.pn.pi_ = extraout_RDX.pi_;
      PVar7.px = (element_type *)this;
      return PVar7;
    }
    this_01 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_01,
         "GeneralizedMAAStarPlannerForDecPOMDPDiscrete::ConstructExtendedJointPolicy --- jpolPrevTs.GetPolicyDomainCategory() != PolicyGlobals::TYPE_INDEX "
        );
  }
  else {
    this_01 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_01,
         "GeneralizedMAAStarPlannerForDecPOMDPDiscrete::ConstructExtendedJointPolicy --- jpolPrevTs.GetPolicyDomainCategory() != PolicyGlobals::OHIST_INDEX "
        );
  }
  __cxa_throw(this_01,&E::typeinfo,E::~E);
}

Assistant:

PJPDP_sharedPtr
GeneralizedMAAStarPlannerForDecPOMDPDiscrete::ConstructExtendedJointPolicy(
        const PartialJointPolicyDiscretePure& jpolPrevTs, 
        const JointPolicyDiscretePure& jpolBG,
        const vector<size_t>& nrOHts, 
        const vector<Index>& firstOHtsI)
{
    //check policy types
    if(jpolPrevTs.GetPolicyDomainCategory() != PolicyGlobals::OHIST_INDEX)
        throw E("GeneralizedMAAStarPlannerForDecPOMDPDiscrete::ConstructExtendedJointPolicy --- jpolPrevTs.GetPolicyDomainCategory() != PolicyGlobals::OHIST_INDEX ");
    if(jpolBG.GetPolicyDomainCategory() != PolicyGlobals::TYPE_INDEX)
        throw E("GeneralizedMAAStarPlannerForDecPOMDPDiscrete::ConstructExtendedJointPolicy --- jpolPrevTs.GetPolicyDomainCategory() != PolicyGlobals::TYPE_INDEX ");
    //construct a policy for the DecPOMDP: 
    //a copy of jpolPrevTs with extended to this time step (ts) by 
    //jpolBG
    PJPDP_sharedPtr jpolTs =
        PJPDP_sharedPtr(
            new PartialJointPolicyPureVector(jpolPrevTs));
    jpolTs->SetDepth( jpolTs->GetDepth()+1 );
    for(Index agentI=0; agentI < GetNrAgents(); agentI++)
    {
        for(Index type = 0; type < nrOHts[agentI]; type++)
        {
            Index ohI = type + firstOHtsI[agentI];
            jpolTs->SetAction(agentI, ohI, 
                    jpolBG.GetActionIndex(agentI, type) );
        }         
    }
    return(jpolTs);
}